

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.h
# Opt level: O2

void __thiscall tetgenmesh::tssbond1(tetgenmesh *this,triface *t,face *s)

{
  tetrahedron ppdVar1;
  int i;
  long lVar2;
  
  ppdVar1 = t->tet[8];
  if (ppdVar1 == (tetrahedron)0x0) {
    ppdVar1 = (tetrahedron)memorypool::alloc(this->tet2segpool);
    t->tet[8] = ppdVar1;
    for (lVar2 = 0; ppdVar1 = t->tet[8], lVar2 != 6; lVar2 = lVar2 + 1) {
      ppdVar1[lVar2] = (double *)0x0;
    }
  }
  ppdVar1[ver2edge[t->ver]] = (double *)((long)s->shver | (ulong)s->sh);
  return;
}

Assistant:

inline void tetgenmesh::tssbond1(triface& t, face& s)
{
  if ((t).tet[8] == NULL) {
    // Allocate space for this tet.
    (t).tet[8] = (tetrahedron) tet2segpool->alloc();
    // Initialization.
    for (int i = 0; i < 6; i++) {
      ((shellface *) (t).tet[8])[i] = NULL;
    }
  }
  ((shellface *) (t).tet[8])[ver2edge[(t).ver]] = sencode((s)); 
}